

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O2

void __thiscall Rml::ElementDocument::ReloadStyleSheet(ElementDocument *this)

{
  String *path;
  bool bVar1;
  String *document_base_tag;
  ElementDocument *pEVar2;
  ElementPtr temp_doc;
  UniquePtr<Rml::StreamFile> stream;
  __shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  if (this->context != (Context *)0x0) {
    ::std::make_unique<Rml::StreamFile>();
    path = &this->source_url;
    bVar1 = StreamFile::Open((StreamFile *)
                             stream._M_t.
                             super___uniq_ptr_impl<Rml::StreamFile,_std::default_delete<Rml::StreamFile>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Rml::StreamFile_*,_std::default_delete<Rml::StreamFile>_>
                             .super__Head_base<0UL,_Rml::StreamFile_*,_false>._M_head_impl,path);
    if (bVar1) {
      Factory::ClearStyleSheetCache();
      Factory::ClearTemplateCache();
      document_base_tag = Context::GetDocumentsBaseTag_abi_cxx11_(this->context);
      Factory::InstanceDocumentStream
                ((Factory *)&temp_doc,(Context *)0x0,
                 (Stream *)
                 stream._M_t.
                 super___uniq_ptr_impl<Rml::StreamFile,_std::default_delete<Rml::StreamFile>_>._M_t.
                 super__Tuple_impl<0UL,_Rml::StreamFile_*,_std::default_delete<Rml::StreamFile>_>.
                 super__Head_base<0UL,_Rml::StreamFile_*,_false>._M_head_impl,document_base_tag);
      if ((__uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>)
          temp_doc._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
          super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
          super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl ==
          (__uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>)0x0) {
        Log::Message(LT_WARNING,"Failed to reload style sheet, could not instance document: %s",
                     (path->_M_dataplus)._M_p);
      }
      else {
        pEVar2 = rmlui_static_cast<Rml::ElementDocument*,Rml::Element*>
                           ((Element *)
                            temp_doc._M_t.
                            super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                            super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                            super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl);
        ::std::__shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_28,
                   &(pEVar2->style_sheet_container).
                    super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>);
        SetStyleSheetContainer(this,(SharedPtr<StyleSheetContainer> *)&local_28);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
      }
      ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr(&temp_doc);
    }
    else {
      Log::Message(LT_WARNING,"Failed to open file to reload style sheet in document: %s",
                   (path->_M_dataplus)._M_p);
    }
    ::std::unique_ptr<Rml::StreamFile,_std::default_delete<Rml::StreamFile>_>::~unique_ptr(&stream);
  }
  return;
}

Assistant:

void ElementDocument::ReloadStyleSheet()
{
	if (!context)
		return;

	auto stream = MakeUnique<StreamFile>();
	if (!stream->Open(source_url))
	{
		Log::Message(Log::LT_WARNING, "Failed to open file to reload style sheet in document: %s", source_url.c_str());
		return;
	}

	Factory::ClearStyleSheetCache();
	Factory::ClearTemplateCache();
	ElementPtr temp_doc = Factory::InstanceDocumentStream(nullptr, stream.get(), context->GetDocumentsBaseTag());
	if (!temp_doc)
	{
		Log::Message(Log::LT_WARNING, "Failed to reload style sheet, could not instance document: %s", source_url.c_str());
		return;
	}

	SetStyleSheetContainer(rmlui_static_cast<ElementDocument*>(temp_doc.get())->style_sheet_container);
}